

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void run_test(wstring_view *text,value *expected)

{
  _Head_base<0UL,_mjs::block_statement_*,_false> _Var1;
  undefined8 uVar2;
  bool bVar3;
  wostream *pwVar4;
  value *v;
  value *v_00;
  int iVar5;
  interpreter i;
  value res;
  anon_class_24_3_46a01442 pb;
  gc_heap h;
  wostringstream error_stream;
  _Head_base<0UL,_mjs::block_statement_*,_false> local_290;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_278;
  wstring local_260;
  value local_240;
  anon_class_24_3_46a01442 local_218;
  gc_heap local_200;
  string_view local_190 [7];
  ios_base local_120 [264];
  
  if (((run_test_func == (char *)0x0) || (run_test_file == (char *)0x0)) || (run_test_line == 0)) {
    __assert_fail("run_test_func && run_test_file && run_test_line",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x1a
                  ,"void run_test(const std::wstring_view &, const value &)");
  }
  mjs::gc_heap::gc_heap(&local_200,run_test::storage,0x200000);
  local_290._M_head_impl = (block_statement *)0x0;
  local_288._0_4_ = tested_version_;
  local_190[0]._M_len = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mjs::source_file,std::allocator<mjs::source_file>,wchar_t_const(&)[5],std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&,mjs::version>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_190[0]._M_str,
             (source_file **)local_190,(allocator<mjs::source_file> *)&local_260,
             (wchar_t (*) [5])L"test",text,(version *)local_288);
  mjs::parse((mjs *)&local_240,(shared_ptr<mjs::source_file> *)local_190,non_strict);
  uVar2 = local_240._0_8_;
  _Var1._M_head_impl = local_290._M_head_impl;
  local_240._0_8_ = (long *)0x0;
  local_290._M_head_impl = (block_statement *)uVar2;
  if (_Var1._M_head_impl != (block_statement *)0x0) {
    (*((_Var1._M_head_impl)->super_statement).super_syntax_node._vptr_syntax_node[1])();
    if ((long *)local_240._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_240._0_8_ + 8))();
    }
  }
  local_240._0_8_ = 0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190[0]._M_str !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190[0]._M_str);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_190);
  local_218.bs = (unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> *)
                 &local_290;
  local_240._0_8_ = local_240._0_8_ & 0xffffffff00000000;
  local_278._M_allocated_capacity = 0;
  local_278._8_8_ = (gc_heap *)0x0;
  local_288._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
        *)0x0;
  local_288._8_8_ = 0.0;
  local_218.error_stream = (wostringstream *)local_190;
  local_218.text = text;
  mjs::interpreter::interpreter
            ((interpreter *)&local_260,&local_200,tested_version_,
             (on_statement_executed_type *)local_288);
  if ((_Manager_type)local_278._M_allocated_capacity != (_Manager_type)0x0) {
    (*(code *)local_278._M_allocated_capacity)(local_288,local_288,3);
  }
  mjs::interpreter::eval
            ((value *)local_288,(interpreter *)&local_260,&(local_290._M_head_impl)->super_statement
            );
  mjs::value::operator=(&local_240,(value *)local_288);
  mjs::value::destroy((value *)local_288);
  mjs::interpreter::~interpreter((interpreter *)&local_260);
  bVar3 = mjs::operator==(&local_240,expected);
  if (bVar3) {
    mjs::value::destroy(&local_240);
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
    if (local_290._M_head_impl != (block_statement *)0x0) {
      (*((local_290._M_head_impl)->super_statement).super_syntax_node._vptr_syntax_node[1])();
    }
    mjs::gc_heap::garbage_collect(&local_200);
    iVar5 = (int)(((ulong)(local_200.alloc_context_.next_free_ - local_200.alloc_context_.start_) *
                  100) / (ulong)(local_200.alloc_context_.capacity_ -
                                local_200.alloc_context_.start_));
    if (iVar5 == 0) {
      mjs::gc_heap::~gc_heap(&local_200);
      return;
    }
    pwVar4 = std::operator<<((wostream *)&std::wcout,"Leaks! Used now: ");
    std::wostream::operator<<((wostream *)pwVar4,iVar5);
    local_190[0]._M_len = 5;
    local_190[0]._M_str = "Leaks";
    mjs::throw_runtime_error
              (local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x5e);
  }
  run_test::anon_class_24_3_46a01442::operator()(&local_218);
  pwVar4 = std::operator<<((wostream *)local_190,"Expecting ");
  mjs::debug_string_abi_cxx11_((wstring *)local_288,(mjs *)expected,v);
  pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar4,(wchar_t *)local_288._0_8_,local_288._8_8_);
  pwVar4 = std::operator<<(pwVar4," got ");
  mjs::debug_string_abi_cxx11_(&local_260,(mjs *)&local_240,v_00);
  pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar4,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::operator<<(pwVar4,"\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_288._0_8_ != &local_278) {
    operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity * 4 + 4);
  }
  std::__cxx11::wstringbuf::str();
  local_260._M_dataplus._M_p = (pointer)local_288._8_8_;
  local_260._M_string_length = local_288._0_8_;
  mjs::throw_runtime_error
            ((wstring_view *)&local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x56);
}

Assistant:

void run_test(const std::wstring_view& text, const value& expected) {
    assert(run_test_func && run_test_file && run_test_line);

    // Use local heap, even if expected lives in another heap
    constexpr uint32_t num_slots = 1<<21;
#ifndef MJS_GC_STRESS_TEST
    // Re-use storage unless we're stress testing
    static uint64_t storage[num_slots];
    gc_heap h{storage, num_slots};
#else
    gc_heap h{num_slots};
#endif

    {
        decltype(parse(nullptr)) bs;
        try {
            bs = parse(std::make_shared<source_file>(L"test", text, tested_version()));
        } catch (const std::exception& e) {
            std::wcout << "Parse failed for \"" << text << "\": " << e.what() <<  "\n";
            throw;
        }
        std::wostringstream error_stream;
        auto pb = [&]() {
            const char * start = "----------------\n";
            const char * end = "----------------\n\n";

            error_stream << "\n";
            error_stream << run_test_file << ":" << run_test_line << " in " << run_test_func << ":\n";

            error_stream << "Test failure in:\n";
            error_stream << start;
            error_stream << text << "\n";
            error_stream << end;

            error_stream << "Parsed as:\n";
            error_stream << start;
            for (const auto& s: bs->l()) {
                error_stream << *s << "\n\n";
            }
            error_stream << end;

            error_stream << "Pretty printed:\n";
            error_stream << start;
            print(error_stream, *bs);
            error_stream << "\n";
            error_stream << end;

            error_stream << "\n";
        };
        value res;
        try {
            interpreter i{h, tested_version()};
            res = i.eval(*bs);
        } catch (const std::exception& e) {
            pb();
            error_stream << "Unexpected exception thrown: " << e.what() << "\n";
            THROW_RUNTIME_ERROR(error_stream.str());
        }
        if (res != expected) {
            pb();
            error_stream << "Expecting " << debug_string(expected) << " got " << debug_string(res) << "\n";
            THROW_RUNTIME_ERROR(error_stream.str());
        }
    }

    h.garbage_collect();
    const auto used_now = h.use_percentage();
    if (used_now) {
        std::wcout << "Leaks! Used now: " << used_now;
        THROW_RUNTIME_ERROR("Leaks");
    }
}